

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
advance_past_space_character
          (jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)this->p_;
  bVar1 = *pbVar2;
  if (bVar1 < 0xd) {
    if (bVar1 == 9) {
LAB_00376c97:
      this->p_ = (char_type *)(pbVar2 + 1);
      this->column_ = this->column_ + 1;
      return;
    }
    if (bVar1 == 10) {
      this->line_ = this->line_ + 1;
      this->column_ = 1;
      this->p_ = (char_type *)(pbVar2 + 1);
      return;
    }
  }
  else if (bVar1 == 0xd) {
    pbVar2 = pbVar2 + 1;
    if ((pbVar2 < this->end_input_) && (*pbVar2 == 10)) {
      this->p_ = (char_type *)pbVar2;
    }
    this->line_ = this->line_ + 1;
    this->column_ = 1;
    this->p_ = this->p_ + 1;
  }
  else if (bVar1 == 0x20) goto LAB_00376c97;
  return;
}

Assistant:

void advance_past_space_character()
        {
            switch (*p_)
            {
                case ' ':case '\t':
                    ++p_;
                    ++column_;
                    break;
                case '\r':
                    if (p_+1 < end_input_)
                    {
                        if (*(p_ + 1) == '\n')
                            ++p_;
                    }
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                case '\n':
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                default:
                    break;
            }
        }